

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
testgen_r::_bigrecord_r_Union__3__::get_bytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          _bigrecord_r_Union__3__ *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  undefined8 *puVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->idx_ == 0) {
    __x = boost::any_cast<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                    (&this->value_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__,__x);
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Invalid type for union","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)local_40);
  *puVar1 = 0x1c87a0;
  puVar1[1] = 0x1c87d0;
  __cxa_throw(puVar1,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
std::vector<uint8_t> _bigrecord_r_Union__3__::get_bytes() const {
    if (idx_ != 0) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::vector<uint8_t> >(value_);
}